

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_3,_2>,_tcu::Matrix<double,_2,_3>_>::call
          (unary<tcu::Matrix<double,_3,_2>,_tcu::Matrix<double,_2,_3>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  int row;
  GLdouble *data;
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined1 auVar5 [16];
  bool bVar7;
  undefined8 uVar8;
  Matrix<double,_3,_2> result;
  Matrix<double,_2,_3> arg;
  undefined8 local_98 [15];
  undefined8 auStack_20 [3];
  long lVar6;
  
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  lVar2 = 0;
  do {
    uVar8 = 0x3ff0000000000000;
    if (lVar2 != 0) {
      uVar8 = 0;
    }
    local_98[lVar2] = uVar8;
    uVar8 = 0x3ff0000000000000;
    if (lVar2 != 1) {
      uVar8 = 0;
    }
    local_98[lVar2 + 3] = uVar8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  lVar2 = 0;
  puVar3 = local_98 + 6;
  bVar7 = true;
  do {
    bVar1 = bVar7;
    lVar4 = 0;
    auVar5 = _DAT_019fcc00;
    do {
      bVar7 = SUB164(auVar5 ^ _DAT_019f5ce0,4) == DAT_01a45900._4_4_ &&
              SUB164(auVar5 ^ _DAT_019f5ce0,0) < DAT_01a45900;
      if (bVar7) {
        uVar8 = 0x3ff0000000000000;
        if (lVar2 * 0x10 != lVar4) {
          uVar8 = 0;
        }
        *(undefined8 *)((long)puVar3 + lVar4) = uVar8;
      }
      if (bVar7) {
        uVar8 = 0x3ff0000000000000;
        if (lVar2 * 0x10 + -0x10 != lVar4) {
          uVar8 = 0;
        }
        *(undefined8 *)((long)puVar3 + lVar4 + 0x10) = uVar8;
      }
      lVar6 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0x40);
    lVar2 = 1;
    puVar3 = local_98 + 7;
    bVar7 = false;
  } while (bVar1);
  lVar2 = 0;
  do {
    uVar8 = ((undefined8 *)((long)argument_src + lVar2))[1];
    *(undefined8 *)((long)local_98 + lVar2 + 0x30) = *(undefined8 *)((long)argument_src + lVar2);
    *(undefined8 *)((long)local_98 + lVar2 + 0x38) = uVar8;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x30);
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(local_98 + 0xc,local_98 + 6);
  lVar2 = 0;
  do {
    local_98[lVar2] = local_98[lVar2 + 0xc];
    local_98[lVar2 + 3] = local_98[lVar2 + 0xf];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  *(undefined8 *)((long)result_dst + 0x10) = local_98[2];
  *(undefined8 *)result_dst = local_98[0];
  *(undefined8 *)((long)result_dst + 8) = local_98[1];
  *(undefined8 *)((long)result_dst + 0x18) = local_98[3];
  *(undefined8 *)((long)result_dst + 0x20) = local_98[4];
  *(undefined8 *)((long)result_dst + 0x28) = local_98[5];
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}